

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1517.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  WriteThis pooh;
  
  pooh.readptr = data;
  sVar2 = strlen(data);
  pooh.sizeleft = sVar2;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x2f,1), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar3,0x3c,sVar2), iVar1 == 0)) &&
         (((iVar1 = curl_easy_setopt(lVar3,0x4e2c,read_callback), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar3,0x2719,&pooh), iVar1 == 0)) &&
          ((iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 == 0)))))) {
        iVar1 = curl_easy_perform(lVar3);
      }
      curl_easy_cleanup(lVar3);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  struct WriteThis pooh;

  pooh.readptr = data;
  pooh.sizeleft = strlen(data);

  if(curl_global_init(CURL_GLOBAL_ALL)) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* Set the expected POST size */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)pooh.sizeleft);

  /* we want to use our own read function */
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* pointer to pass to our read function */
  test_setopt(curl, CURLOPT_READDATA, &pooh);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* detect HTTP error codes >= 400 */
  /* test_setopt(curl, CURLOPT_FAILONERROR, 1L); */


  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}